

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
VulkanHppGenerator::generateProtection
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,VulkanHppGenerator *this,string *protect,bool defined)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  byte local_95;
  byte local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  pair<const_char_*,_const_char_*> local_40;
  char *local_30;
  char *openProtect;
  string *psStack_20;
  bool defined_local;
  string *protect_local;
  VulkanHppGenerator *this_local;
  
  local_30 = "#if !defined( ";
  if (defined) {
    local_30 = "#if defined( ";
  }
  openProtect._7_1_ = defined;
  psStack_20 = protect;
  protect_local = &this->m_api;
  this_local = (VulkanHppGenerator *)__return_storage_ptr__;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (protect);
  local_81 = 0;
  local_95 = 0;
  if (bVar1) {
    local_40 = std::make_pair<char_const(&)[1],char_const(&)[1]>
                         ((char (*) [1])0x2d801a,(char (*) [1])0x2d801a);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_*,_const_char_*,_true>(__return_storage_ptr__,&local_40);
  }
  else {
    std::operator+(&local_80,local_30,psStack_20);
    local_81 = 1;
    std::operator+(&local_60,&local_80," )\n");
    local_95 = 1;
    std::operator+(&local_d8,"#endif /*",psStack_20);
    std::operator+(&local_b8,&local_d8,"*/\n");
    std::make_pair<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,&local_60,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  if ((local_95 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  if ((local_81 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> VulkanHppGenerator::generateProtection( std::string const & protect, bool defined ) const
{
  auto const openProtect = defined ? "#if defined( " : "#if !defined( ";
  return protect.empty() ? std::make_pair( "", "" ) : std::make_pair( openProtect + protect + " )\n", "#endif /*" + protect + "*/\n" );
}